

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

void aom_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  undefined4 local_60;
  int zbins [2];
  int nzbins [2];
  
  bVar2 = (byte)log_scale;
  iVar6 = (1 << (bVar2 & 0x1f)) >> 1;
  zbins[0] = *zbin_ptr + iVar6 >> (bVar2 & 0x1f);
  nzbins[0] = -zbins[0];
  zbins[1] = zbin_ptr[1] + iVar6 >> (bVar2 & 0x1f);
  nzbins[1] = -zbins[1];
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  uVar5 = n_coeffs & 0xffffffff;
  while (uVar4 = uVar5, 0 < (int)uVar4) {
    sVar1 = scan[uVar4 - 1];
    uVar7 = 0x20;
    if (qm_ptr != (qm_val_t *)0x0) {
      uVar7 = (uint)qm_ptr[sVar1];
    }
    iVar8 = uVar7 * coeff_ptr[sVar1];
    if ((zbins[sVar1 != 0] * 0x20 <= iVar8) ||
       (uVar5 = uVar4 - 1,
       iVar8 + nzbins[sVar1 != 0] * -0x20 == 0 || iVar8 < nzbins[sVar1 != 0] * 0x20))
    goto LAB_00241424;
  }
  uVar4 = (ulong)((int)(uint)n_coeffs >> 0x1f & (uint)n_coeffs);
LAB_00241424:
  uVar9 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar9;
  }
  local_60 = 0xffffffff;
  for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    sVar1 = scan[uVar9];
    iVar8 = coeff_ptr[sVar1];
    iVar10 = -iVar8;
    if (0 < iVar8) {
      iVar10 = iVar8;
    }
    if (qm_ptr == (qm_val_t *)0x0) {
      bVar3 = 0x20;
    }
    else {
      bVar3 = qm_ptr[sVar1];
    }
    bVar13 = sVar1 != 0;
    if (zbins[bVar13] * 0x20 <= (int)(iVar10 * (uint)bVar3)) {
      uVar4 = (ulong)((uint)bVar13 * 2);
      iVar10 = (*(short *)((long)round_ptr + uVar4) + iVar6 >> (bVar2 & 0x1f)) + iVar10;
      if (0x7ffe < iVar10) {
        iVar10 = 0x7fff;
      }
      if (iVar10 < -0x7fff) {
        iVar10 = -0x8000;
      }
      uVar11 = iVar8 >> 0x1f;
      uVar12 = (uint)((long)((long)*(short *)((long)quant_shift_ptr + uVar4) *
                            (((long)((long)*(short *)((long)quant_ptr + uVar4) *
                                    (ulong)bVar3 * (long)iVar10) >> 0x10) +
                            (ulong)bVar3 * (long)iVar10)) >> (0x15 - bVar2 & 0x3f));
      qcoeff_ptr[sVar1] = (uVar11 ^ uVar12) - uVar11;
      uVar7 = 0x20;
      if (iqm_ptr != (qm_val_t *)0x0) {
        uVar7 = (uint)iqm_ptr[sVar1];
      }
      dqcoeff_ptr[sVar1] =
           ((int)(((int)((int)dequant_ptr[bVar13] * uVar7 + 0x10) >> 5) * uVar12) >> (bVar2 & 0x1f)
           ^ uVar11) - uVar11;
      if (uVar12 != 0) {
        local_60 = (undefined4)uVar9;
      }
    }
  }
  *eob_ptr = (short)local_60 + 1;
  return;
}

Assistant:

void aom_quantize_b_helper_c(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                             const int16_t *zbin_ptr, const int16_t *round_ptr,
                             const int16_t *quant_ptr,
                             const int16_t *quant_shift_ptr,
                             tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                             const int16_t *dequant_ptr, uint16_t *eob_ptr,
                             const int16_t *scan, const int16_t *iscan,
                             const qm_val_t *qm_ptr, const qm_val_t *iqm_ptr,
                             const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS)) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) eob = i;
    }
  }
  *eob_ptr = eob + 1;
}